

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

CVmTimeZone * __thiscall CVmTimeZoneCache::parse_zone(CVmTimeZoneCache *this,char *name,size_t len)

{
  int iVar1;
  CVmTimeZone *pCVar2;
  
  if (len == 0 || name == (char *)0x0) {
LAB_00280ef6:
    pCVar2 = get_local_zone(this);
    return pCVar2;
  }
  if (len == 6) {
    iVar1 = bcmp(name,":local",6);
    if (iVar1 == 0) goto LAB_00280ef6;
  }
  pCVar2 = parse_zone_2(this,name,len);
  return pCVar2;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone(VMG_ const char *name, size_t len)
{
    /* treat a null, empty string, or ":local" as the local zone */
    if (name == 0 || len == 0
        || (len == 6 && memcmp(name, ":local", 6) == 0))
        return get_local_zone(vmg0_);

    /* look for all names other than the ":local" pseudo-name */
    return parse_zone_2(vmg_ name, len);
}